

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O2

void Gia_ManHighlight_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  uint uVar4;
  
  while( true ) {
    iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
    if (iVar1 != 0) {
      return;
    }
    if (p->nTravIdsAlloc <= iObj) break;
    p->pTravIds[iObj] = p->nTravIds;
    pGVar2 = Gia_ManObj(p,iObj);
    uVar3 = *(ulong *)pGVar2;
    uVar4 = (uint)(uVar3 & 0x1fffffff);
    if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar3) {
      Gia_ManHighlight_rec(p,iObj - ((uint)uVar3 & 0x1fffffff));
      uVar3 = *(ulong *)pGVar2;
      uVar4 = (uint)uVar3 & 0x1fffffff;
    }
    if ((int)uVar3 < 0) {
      return;
    }
    if (uVar4 == 0x1fffffff) {
      return;
    }
    iObj = iObj - ((uint)(uVar3 >> 0x20) & 0x1fffffff);
  }
  __assert_fail("Id < p->nTravIdsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManHighlight_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManHighlight_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManHighlight_rec( p, Gia_ObjFaninId1(pObj, iObj) );
}